

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmMakefileTargetGenerator::WriteMakeRule
          (cmMakefileTargetGenerator *this,ostream *os,char *comment,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *depends,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,bool in_help)

{
  bool bVar1;
  string *sourceName;
  value_type *__value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  bool bVar3;
  cmSourceFile *pcVar4;
  undefined7 extraout_var;
  pointer source;
  byte bVar5;
  uint uVar6;
  allocator local_ed;
  uint local_ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  ostream *local_e0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_d8;
  ulong local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_commands;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_depends;
  string out;
  value_type p;
  
  sourceName = (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == sourceName) {
    bVar5 = 0;
    goto LAB_004487ef;
  }
  bVar1 = (this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
          NeedSymbolicMark;
  local_e8 = outputs;
  local_e0 = os;
  if (bVar1 == true) {
    pcVar4 = cmMakefile::GetSource((this->super_cmCommonTargetGenerator).Makefile,sourceName);
    if (pcVar4 == (cmSourceFile *)0x0) goto LAB_00448628;
    std::__cxx11::string::string((string *)&p,"SYMBOLIC",(allocator *)&out);
    bVar3 = cmSourceFile::GetPropertyAsBool(pcVar4,&p.first);
    std::__cxx11::string::~string((string *)&p);
    local_ec = (uint)CONCAT71(extraout_var,bVar3);
  }
  else {
LAB_00448628:
    local_ec = 0;
  }
  pvVar2 = local_e8;
  local_d0 = (ulong)in_help;
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            (this->LocalGenerator,local_e0,comment,
             (local_e8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,depends,commands,SUB41(local_ec,0),in_help);
  __value = (pvVar2->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(pvVar2->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)__value == 0x20) {
    bVar5 = (byte)local_ec;
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&output_depends,1,__value,(allocator_type *)&p);
    source = (local_e8->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_d8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->MultipleOutputPairs;
    uVar6 = local_ec;
    while( true ) {
      bVar5 = (byte)uVar6;
      source = source + 1;
      if (source == (local_e8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) break;
      cmCommonTargetGenerator::Convert
                (&out,&this->super_cmCommonTargetGenerator,source,HOME_OUTPUT,SHELL);
      output_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      output_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      output_commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (bVar1 == false) {
LAB_0044874a:
        std::operator+(&p.first,"@$(CMAKE_COMMAND) -E touch_nocreate ",&out);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &output_commands,&p.first);
        std::__cxx11::string::~string((string *)&p);
        uVar6 = 0;
        bVar3 = false;
      }
      else {
        pcVar4 = cmMakefile::GetSource((this->super_cmCommonTargetGenerator).Makefile,source);
        if (pcVar4 == (cmSourceFile *)0x0) goto LAB_0044874a;
        std::__cxx11::string::string((string *)&p,"SYMBOLIC",&local_ed);
        bVar3 = cmSourceFile::GetPropertyAsBool(pcVar4,&p.first);
        std::__cxx11::string::~string((string *)&p);
        if (!bVar3) goto LAB_0044874a;
        uVar6 = (uint)(bVar5 & bVar3);
        bVar3 = true;
      }
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (this->LocalGenerator,local_e0,(char *)0x0,source,&output_depends,&output_commands,
                 bVar3,SUB81(local_d0,0));
      if (bVar3 == false) {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&p,source,
                   (local_e8->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                  (local_d8,&p);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&output_commands);
      std::__cxx11::string::~string((string *)&out);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&output_depends);
  }
LAB_004487ef:
  return (bool)(bVar5 & 1);
}

Assistant:

bool cmMakefileTargetGenerator::WriteMakeRule(
  std::ostream& os,
  const char* comment,
  const std::vector<std::string>& outputs,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands,
  bool in_help)
{
  bool symbolic = false;
  if (outputs.size() == 0)
    {
    return symbolic;
    }

  // Check whether we need to bother checking for a symbolic output.
  bool need_symbolic = this->GlobalGenerator->GetNeedSymbolicMark();

  // Check whether the first output is marked as symbolic.
  if(need_symbolic)
    {
    if(cmSourceFile* sf = this->Makefile->GetSource(outputs[0]))
      {
      symbolic = sf->GetPropertyAsBool("SYMBOLIC");
      }
    }

  // We always attach the actual commands to the first output.
  this->LocalGenerator->WriteMakeRule(os, comment, outputs[0], depends,
                                      commands, symbolic, in_help);

  // For single outputs, we are done.
  if (outputs.size() == 1)
    {
    return symbolic;
    }

  // For multiple outputs, make the extra ones depend on the first one.
  std::vector<std::string> const output_depends(1, outputs[0]);
  for (std::vector<std::string>::const_iterator o = outputs.begin()+1;
       o != outputs.end(); ++o)
    {
    // Touch the extra output so "make" knows that it was updated,
    // but only if the output was acually created.
    std::string const out = this->Convert(*o, cmLocalGenerator::HOME_OUTPUT,
                                          cmLocalGenerator::SHELL);
    std::vector<std::string> output_commands;

    bool o_symbolic = false;
    if(need_symbolic)
      {
      if(cmSourceFile* sf = this->Makefile->GetSource(*o))
        {
        o_symbolic = sf->GetPropertyAsBool("SYMBOLIC");
        }
      }
    symbolic = symbolic && o_symbolic;

    if (!o_symbolic)
      {
      output_commands.push_back("@$(CMAKE_COMMAND) -E touch_nocreate " + out);
      }
    this->LocalGenerator->WriteMakeRule(os, 0, *o, output_depends,
                                        output_commands, o_symbolic, in_help);

    if (!o_symbolic)
      {
      // At build time, remove the first output if this one does not exist
      // so that "make" will rerun the real commands that create this one.
      MultipleOutputPairsType::value_type p(*o, outputs[0]);
      this->MultipleOutputPairs.insert(p);
      }
    }
  return symbolic;
}